

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

history_chart * findchart(history_chart *hs,uint idx)

{
  for (; (hs != (history_chart *)0x0 && (hs->idx != idx)); hs = hs->next) {
  }
  return hs;
}

Assistant:

static struct history_chart *findchart(struct history_chart *hs,
									   unsigned int idx) {
	for (; hs; hs = hs->next)
		if (hs->idx == idx)
			break;
	return hs;
}